

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O1

ostream * operator<<(ostream *stream,LightEdge *e)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(stream,"(",1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)stream);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  return stream;
}

Assistant:

std::ostream &operator<<(std::ostream &stream, const Graph::LightEdge &e) {
    stream << "(" << e.u << ", " << e.v << ")";
    return stream;
}